

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O0

void __thiscall Fl_Window::_Fl_Window(Fl_Window *this)

{
  icon_data *piVar1;
  Fl_Window *this_local;
  
  Fl_Widget::type((Fl_Widget *)this,0xf0);
  Fl_Widget::box((Fl_Widget *)this,FL_FLAT_BOX);
  if (Fl::scheme_bg_ == (Fl_Image *)0x0) {
    Fl_Widget::labeltype((Fl_Widget *)this,FL_NO_LABEL);
  }
  else {
    Fl_Widget::labeltype((Fl_Widget *)this,FL_NORMAL_LABEL);
    Fl_Widget::align((Fl_Widget *)this,0x50);
    Fl_Widget::image((Fl_Widget *)this,Fl::scheme_bg_);
  }
  this->i = (Fl_X *)0x0;
  this->xclass_ = (char *)0x0;
  piVar1 = (icon_data *)operator_new(0x18);
  this->icon_ = piVar1;
  memset(this->icon_,0,0x18);
  this->iconlabel_ = (char *)0x0;
  Fl_Group::resizable(&this->super_Fl_Group,(Fl_Widget *)0x0);
  this->size_range_set = '\0';
  this->maxh = 0;
  this->minh = 0;
  this->maxw = 0;
  this->minw = 0;
  shape_data_ = (shape_data_type *)0x0;
  Fl_Widget::callback((Fl_Widget *)this,default_callback);
  return;
}

Assistant:

void Fl_Window::_Fl_Window() {
  type(FL_WINDOW);
  box(FL_FLAT_BOX);
  if (Fl::scheme_bg_) {
    labeltype(FL_NORMAL_LABEL);
    align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
    image(Fl::scheme_bg_);
  } else {
    labeltype(FL_NO_LABEL);
  }
  i = 0;
  xclass_ = 0;
  icon_ = new icon_data;
  memset(icon_, 0, sizeof(*icon_));
  iconlabel_ = 0;
  resizable(0);
  size_range_set = 0;
  minw = maxw = minh = maxh = 0;
  shape_data_ = NULL;

#if FLTK_ABI_VERSION >= 10301
  no_fullscreen_x = 0;
  no_fullscreen_y = 0;
  no_fullscreen_w = w();
  no_fullscreen_h = h();
#endif

#if FLTK_ABI_VERSION >= 10303
  fullscreen_screen_top = -1;
  fullscreen_screen_bottom = -1;
  fullscreen_screen_left = -1;
  fullscreen_screen_right = -1;
#endif

  callback((Fl_Callback*)default_callback);
}